

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Miter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Gia_Man_t *pNew;
  FILE *__stream;
  Gia_Man_t *pGVar6;
  char *pcVar7;
  int iVar8;
  char *pcVar9;
  uint fVerbose;
  uint fDualOut;
  uint fSeq;
  uint local_4c;
  
  local_4c = 0;
  Extra_UtilGetoptReset();
  fDualOut = 0;
  fSeq = 0;
  bVar4 = false;
  bVar2 = false;
  bVar3 = false;
  bVar1 = false;
  fVerbose = 0;
  do {
    while( true ) {
      while (iVar5 = Extra_UtilGetopt(argc,argv,"Idstxyzvh"), iVar8 = globalUtilOptind, 0x72 < iVar5
            ) {
        switch(iVar5) {
        case 0x73:
          fSeq = fSeq ^ 1;
          break;
        case 0x74:
          bVar4 = (bool)(bVar4 ^ 1);
          break;
        default:
          goto switchD_0027e6d7_caseD_75;
        case 0x76:
          fVerbose = fVerbose ^ 1;
          break;
        case 0x78:
          bVar2 = (bool)(bVar2 ^ 1);
          break;
        case 0x79:
          bVar3 = (bool)(bVar3 ^ 1);
          break;
        case 0x7a:
          bVar1 = (bool)(bVar1 ^ 1);
        }
      }
      if (iVar5 == 0x49) break;
      if (iVar5 != 100) {
        if (iVar5 == -1) {
          if (((bVar4 || bVar2) || bVar1) || bVar3) {
            pGVar6 = pAbc->pGia;
            if (pGVar6 != (Gia_Man_t *)0x0) {
              if ((pGVar6->vCos->nSize - pGVar6->nRegs & 1U) != 0) {
                pcVar7 = "Abc_CommandAbc9Miter(): The number of outputs should be even.\n";
                goto LAB_0027ea91;
              }
              if (bVar4) {
                pNew = Gia_ManTransformMiter(pGVar6);
                pcVar7 = "The miter (current AIG) is transformed by XORing POs pair-wise.\n";
              }
              else if (bVar2) {
                pNew = Gia_ManTransformMiter2(pGVar6);
                pcVar7 = 
                "The miter (current AIG) is transformed by XORing POs of two word-level outputs.\n";
              }
              else if (bVar1) {
                pNew = Gia_ManTransformDualOutput(pGVar6);
                pcVar7 = "The dual-output miter (current AIG) is transformed by ordering sides.\n";
              }
              else {
                pNew = Gia_ManTransformTwoWord2DualOutput(pGVar6);
                pcVar7 = "The miter (current AIG) is transformed from two-word to dual-output.\n";
              }
              Abc_Print(1,pcVar7);
              goto LAB_0027ead6;
            }
            pcVar7 = "Abc_CommandAbc9Miter(): There is no AIG.\n";
          }
          else {
            if (argc - globalUtilOptind == 1) {
              pcVar7 = argv[globalUtilOptind];
              pcVar9 = pcVar7;
              goto LAB_0027e972;
            }
            pcVar7 = "File name is not given on the command line.\n";
          }
          iVar8 = -1;
          goto LAB_0027e934;
        }
        goto switchD_0027e6d7_caseD_75;
      }
      fDualOut = fDualOut ^ 1;
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-I\" should be followed by a char string.\n");
      break;
    }
    local_4c = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar8 + 1;
  } while (-1 < (int)local_4c);
switchD_0027e6d7_caseD_75:
  Abc_Print(-2,"usage: &miter [-I num] [-dstxyzvh] <file>\n");
  Abc_Print(-2,"\t         creates miter of two designs (current AIG vs. <file>)\n");
  Abc_Print(-2,"\t-I num : the number of last PIs to replicate [default = %d]\n",(ulong)local_4c);
  pcVar9 = "yes";
  pcVar7 = "yes";
  if (fDualOut == 0) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle creating dual-output miter [default = %s]\n",pcVar7);
  pcVar7 = "yes";
  if (fSeq == 0) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-s     : toggle creating sequential miter [default = %s]\n",pcVar7);
  pcVar7 = "yes";
  if (!bVar4) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-t     : toggle XORing POs of dual-output miter [default = %s]\n",pcVar7);
  pcVar7 = "yes";
  if (!bVar2) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-x     : toggle XORing POs of two-word miter [default = %s]\n",pcVar7);
  pcVar7 = "yes";
  if (!bVar3) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-y     : toggle convering two-word miter into dual-output miter [default = %s]\n",
            pcVar7);
  pcVar7 = "yes";
  if (!bVar1) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-z     : toggle odering sides of the dual-output miter [default = %s]\n",pcVar7);
  if (fVerbose == 0) {
    pcVar9 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar9);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  pcVar7 = "\t<file> : AIGER file with the design to miter\n";
  iVar8 = -2;
LAB_0027e934:
  Abc_Print(iVar8,pcVar7);
  return 1;
LAB_0027e972:
  if (*pcVar9 == '>') {
    *pcVar9 = '\\';
  }
  else if (*pcVar9 == '\0') {
    __stream = fopen(pcVar7,"r");
    if (__stream == (FILE *)0x0) {
      Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar7);
      pcVar7 = Extra_FileGetSimilarName
                         (pcVar7,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (pcVar7 != (char *)0x0) {
        Abc_Print(1,"Did you mean \"%s\"?",pcVar7);
      }
      pcVar7 = "\n";
      iVar8 = 1;
      iVar5 = 1;
    }
    else {
      fclose(__stream);
      pGVar6 = Gia_AigerRead(pcVar7,0,0,0);
      if (pGVar6 != (Gia_Man_t *)0x0) {
        pNew = Gia_ManMiter(pAbc->pGia,pGVar6,local_4c,fDualOut,fSeq,0,fVerbose);
        Gia_ManStop(pGVar6);
LAB_0027ead6:
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      pcVar7 = "Reading AIGER has failed.\n";
LAB_0027ea91:
      iVar8 = 0;
      iVar5 = -1;
    }
    Abc_Print(iVar5,pcVar7);
    return iVar8;
  }
  pcVar9 = pcVar9 + 1;
  goto LAB_0027e972;
}

Assistant:

int Abc_CommandAbc9Miter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Gia_Man_t * pAux;
    Gia_Man_t * pSecond;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int nArgcNew;
    int c;
    int nInsDup  = 0;
    int fDualOut = 0;
    int fSeq     = 0;
    int fTrans   = 0;
    int fTransX  = 0;
    int fConvert = 0;
    int fTransZ  = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Idstxyzvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by a char string.\n" );
                goto usage;
            }
            nInsDup = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInsDup < 0 )
                goto usage;
            break;
        case 'd':
            fDualOut ^= 1;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 't':
            fTrans ^= 1;
            break;
        case 'x':
            fTransX ^= 1;
            break;
        case 'y':
            fConvert ^= 1;
            break;
        case 'z':
            fTransZ ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fTrans || fTransX || fTransZ || fConvert )
    {
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Miter(): There is no AIG.\n" );
            return 1;
        }
        if ( (Gia_ManPoNum(pAbc->pGia) & 1) == 1 )
        {
            Abc_Print( -1, "Abc_CommandAbc9Miter(): The number of outputs should be even.\n" );
            return 0;
        }
        if ( fTrans )
        {
            pAux = Gia_ManTransformMiter( pAbc->pGia );
            Abc_Print( 1, "The miter (current AIG) is transformed by XORing POs pair-wise.\n" );
        }
        else if ( fTransX )
        {
            pAux = Gia_ManTransformMiter2( pAbc->pGia );
            Abc_Print( 1, "The miter (current AIG) is transformed by XORing POs of two word-level outputs.\n" );
        }
        else if ( fTransZ ) 
        {
            extern Gia_Man_t * Gia_ManTransformDualOutput( Gia_Man_t * p );
            pAux = Gia_ManTransformDualOutput( pAbc->pGia );
            Abc_Print( 1, "The dual-output miter (current AIG) is transformed by ordering sides.\n" );
        }
        else
        {
            pAux = Gia_ManTransformTwoWord2DualOutput( pAbc->pGia );
            Abc_Print( 1, "The miter (current AIG) is transformed from two-word to dual-output.\n" );
        }
        Abc_FrameUpdateGia( pAbc, pAux );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
    if ( pSecond == NULL )
    {
        Abc_Print( -1, "Reading AIGER has failed.\n" );
        return 0;
    }
    // compute the miter
    pAux = Gia_ManMiter( pAbc->pGia, pSecond, nInsDup, fDualOut, fSeq, 0, fVerbose );
    Gia_ManStop( pSecond );
    Abc_FrameUpdateGia( pAbc, pAux );
    return 0;

usage:
    Abc_Print( -2, "usage: &miter [-I num] [-dstxyzvh] <file>\n" );
    Abc_Print( -2, "\t         creates miter of two designs (current AIG vs. <file>)\n" );
    Abc_Print( -2, "\t-I num : the number of last PIs to replicate [default = %d]\n", nInsDup );
    Abc_Print( -2, "\t-d     : toggle creating dual-output miter [default = %s]\n", fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle creating sequential miter [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle XORing POs of dual-output miter [default = %s]\n", fTrans? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle XORing POs of two-word miter [default = %s]\n", fTransX? "yes": "no" );
    Abc_Print( -2, "\t-y     : toggle convering two-word miter into dual-output miter [default = %s]\n", fConvert? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle odering sides of the dual-output miter [default = %s]\n", fTransZ? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : AIGER file with the design to miter\n");
    return 1;
}